

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_number(element_t *element,int id,float *number,_Bool percent,_Bool inherit)

{
  _Bool _Var1;
  int iVar2;
  attribute *paVar3;
  size_t sVar4;
  char *__s1;
  float fVar5;
  float fVar6;
  char *local_38;
  
  do {
    for (paVar3 = element->attributes; paVar3 != (attribute *)0x0; paVar3 = paVar3->next) {
      if (paVar3->id == id) {
        if (inherit) {
          __s1 = (paVar3->value).data;
          sVar4 = (paVar3->value).length;
          if (sVar4 == 7) {
            sVar4 = 7;
            iVar2 = strncmp(__s1,"inherit",7);
            if (iVar2 == 0) break;
          }
        }
        else {
          __s1 = (paVar3->value).data;
          sVar4 = (paVar3->value).length;
        }
        local_38 = __s1;
        _Var1 = parse_float(&local_38,__s1 + sVar4,number);
        if (!percent || !_Var1) {
          return _Var1;
        }
        if ((local_38 < __s1 + sVar4) && (*local_38 == '%')) {
          fVar5 = *number / 100.0;
        }
        else {
          fVar5 = *number;
        }
        fVar6 = 0.0;
        if ((0.0 <= fVar5) && (fVar6 = 1.0, fVar5 <= 1.0)) {
          fVar6 = fVar5;
        }
        *number = fVar6;
        return _Var1;
      }
    }
    if ((!inherit) || (element = element->parent, element == (element *)0x0)) {
      return false;
    }
  } while( true );
}

Assistant:

static bool parse_number(const element_t* element, int id, float* number, bool percent, bool inherit)
{
    const string_t* value = find_attribute(element, id, inherit);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(!parse_float(&it, end, number))
        return false;
    if(percent) {
        if(skip_delim(&it, end, '%'))
            *number /= 100.f;
        *number = CLAMP(*number, 0.f, 1.f);
    }

    return true;
}